

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall UnitTestBasehello5::Run(UnitTestBasehello5 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  UnitTestBase *pUVar3;
  Regex r;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  Regex local_48;
  
  bert::Regex::Regex(&local_48,"(a|b|c)*b*");
  bVar2 = bert::Regex::Match(&local_48,"b");
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  if (bVar2) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"\'r.Match(\"b\")\'","");
    pUVar3 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_68,true,false);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"\'r.Match(\"b\")\'","");
    pUVar3 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_68,false,false);
  }
  UnitTestBase::FlushError(pUVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  bVar2 = bert::Regex::Match(&local_48,"bbb");
  if (bVar2) {
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"\'r.Match(\"bbb\")\'","");
    pUVar3 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_a8,true,false);
  }
  else {
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"\'r.Match(\"bbb\")\'","");
    pUVar3 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_a8,false,false);
  }
  UnitTestBase::FlushError(pUVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  bVar2 = bert::Regex::Match(&local_48,"bbbabc");
  paVar1 = &local_88.field_2;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  if (bVar2) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"\'r.Match(\"bbbabc\")\'","");
    pUVar3 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_88,true,false);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"\'r.Match(\"bbbabc\")\'","");
    pUVar3 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_88,false,false);
  }
  UnitTestBase::FlushError(pUVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  bVar2 = bert::Regex::Match(&local_48,"");
  if (bVar2) {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"\'r.Match(\"\")\'","");
    pUVar3 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_c8,true,false);
  }
  else {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"\'r.Match(\"\")\'","");
    pUVar3 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_c8,false,false);
  }
  UnitTestBase::FlushError(pUVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  bert::Regex::~Regex(&local_48);
  return;
}

Assistant:

TEST_CASE(hello5)
{
    Regex r("(a|b|c)*b*");

    EXPECT_TRUE(r.Match("b"));
    EXPECT_TRUE(r.Match("bbb"));
    EXPECT_TRUE(r.Match("bbbabc"));
    EXPECT_TRUE(r.Match(""));
}